

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_3a5ce8::swapFormatVersion3
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int dataCount_1;
  int indexCount_1;
  int dataCount;
  int indexCount;
  uint32_t count;
  UCATableHeader header;
  UCATableHeader *outHeader;
  UCATableHeader *inHeader;
  uint8_t *outBytes;
  uint8_t *inBytes;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar1 = ::U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) || (length < -1)) ||
       ((0 < length && (outData == (void *)0x0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      ds_local._4_4_ = 0;
    }
    else {
      header.reserved._68_8_ = outData;
      memset(&indexCount,0,0xa8);
      if (length < 0) {
        indexCount = udata_readInt32_63(ds,*inData);
      }
      else if ((length < 0xa8) || (indexCount = udata_readInt32_63(ds,*inData), length < indexCount)
              ) {
        udata_printError_63(ds,
                            "ucol_swap(formatVersion=3): too few bytes (%d after header) for collation data\n"
                            ,(ulong)(uint)length);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
      header.UCAConsts = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x10));
      if ((header.UCAConsts == 0x20030618) && (*(char *)((long)inData + 0x50) == '\x03')) {
        if ((*(char *)((long)inData + 0x41) == ds->inIsBigEndian) &&
           (*(uint8_t *)((long)inData + 0x42) == ds->inCharset)) {
          if (-1 < length) {
            if (inData != outData) {
              memcpy(outData,inData,(long)indexCount);
            }
            count = (*ds->readUInt32)(*(uint32_t *)((long)inData + 4));
            header.size = (*ds->readUInt32)(*(uint32_t *)((long)inData + 8));
            header.options = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0xc));
            header.contractionUCACombos = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x14));
            header.magic = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x18));
            header.mappingPosition = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x1c));
            header.expansion = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x20));
            header.contractionIndex = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x24));
            header.contractionCEs = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x28));
            header.contractionSize = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x2c));
            header.endExpansionCE = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0x30));
            header.unsafeCP = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0x3c));
            header.UCDVersion = (UVersionInfo)(*ds->readUInt32)(*(uint32_t *)((long)inData + 0x54));
            header.formatVersion =
                 (UVersionInfo)(*ds->readUInt32)(*(uint32_t *)((long)inData + 0x58));
            (*ds->swapArray32)(ds,inData,0x40,(void *)header.reserved._68_8_,pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)inData + 0x54),8,
                               (void *)(header.reserved._68_8_ + 0x54),pErrorCode);
            *(UBool *)(header.reserved._68_8_ + 0x41) = ds->outIsBigEndian;
            *(uint8_t *)(header.reserved._68_8_ + 0x42) = ds->outCharset;
            if (count != 0) {
              (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)count),header.magic - count,
                                 (void *)((long)outData + (ulong)count),pErrorCode);
            }
            if ((header.contractionUCACombos != 0) && (header.magic != 0)) {
              if (header.mappingPosition == 0) {
                dataCount = header.contractionUCACombos - header.magic;
              }
              else {
                dataCount = header.mappingPosition - header.magic;
              }
              (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)header.magic),dataCount,
                                 (void *)((long)outData + (ulong)header.magic),pErrorCode);
            }
            if (header.contractionIndex != 0) {
              (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)header.mappingPosition),
                                 header.contractionIndex << 1,
                                 (void *)((long)outData + (ulong)header.mappingPosition),pErrorCode)
              ;
              (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)header.expansion),
                                 header.contractionIndex << 2,
                                 (void *)((long)outData + (ulong)header.expansion),pErrorCode);
            }
            if (header.contractionUCACombos != 0) {
              utrie_swap_63(ds,(void *)((long)inData + (ulong)header.contractionUCACombos),
                            header.contractionCEs - header.contractionUCACombos,
                            (void *)((long)outData + (ulong)header.contractionUCACombos),pErrorCode)
              ;
            }
            if (header.endExpansionCE != 0) {
              (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)header.contractionCEs),
                                 header.endExpansionCE << 2,
                                 (void *)((long)outData + (ulong)header.contractionCEs),pErrorCode);
            }
            if (header.size != 0) {
              (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)(uint)header.size),
                                 header.options - header.size,
                                 (void *)((long)outData + (ulong)(uint)header.size),pErrorCode);
            }
            if (header.unsafeCP != 0) {
              (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)header.options),
                                 header.unsafeCP * *(byte *)((long)inData + 0x43) * 2,
                                 (void *)((long)outData + (ulong)header.options),pErrorCode);
            }
            if (header.UCDVersion != (UVersionInfo)0x0) {
              uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + (ulong)(uint)header.UCDVersion)
                                       );
              uVar3 = (*ds->readUInt16)(*(uint16_t *)
                                         ((long)inData + (ulong)(uint)header.UCDVersion + 2));
              (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)(uint)header.UCDVersion),
                                 (uint)uVar2 * 4 + 4 + (uint)uVar3 * 2,
                                 (void *)((long)outData + (ulong)(uint)header.UCDVersion),pErrorCode
                                );
            }
            if (header.formatVersion != (UVersionInfo)0x0) {
              uVar2 = (*ds->readUInt16)(*(uint16_t *)
                                         ((long)inData + (ulong)(uint)header.formatVersion));
              uVar3 = (*ds->readUInt16)(*(uint16_t *)
                                         ((long)inData + (ulong)(uint)header.formatVersion + 2));
              (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)(uint)header.formatVersion),
                                 (uint)uVar2 * 2 + 4 + (uint)uVar3 * 2,
                                 (void *)((long)outData + (ulong)(uint)header.formatVersion),
                                 pErrorCode);
            }
          }
          ds_local._4_4_ = indexCount;
        }
        else {
          udata_printError_63(ds,
                              "ucol_swap(formatVersion=3): endianness %d or charset %d does not match the swapper\n"
                              ,(ulong)(uint)(int)*(char *)((long)inData + 0x41),
                              (ulong)*(byte *)((long)inData + 0x42));
          *pErrorCode = U_INVALID_FORMAT_ERROR;
          ds_local._4_4_ = 0;
        }
      }
      else {
        udata_printError_63(ds,
                            "ucol_swap(formatVersion=3): magic 0x%08x or format version %02x.%02x is not a collation binary\n"
                            ,(ulong)header.UCAConsts,(ulong)*(byte *)((long)inData + 0x50),
                            (ulong)*(byte *)((long)inData + 0x51));
        *pErrorCode = U_UNSUPPORTED_ERROR;
        ds_local._4_4_ = 0;
      }
    }
  }
  else {
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

int32_t
swapFormatVersion3(const UDataSwapper *ds,
                   const void *inData, int32_t length, void *outData,
                   UErrorCode *pErrorCode) {
    const uint8_t *inBytes;
    uint8_t *outBytes;

    const UCATableHeader *inHeader;
    UCATableHeader *outHeader;
    UCATableHeader header;

    uint32_t count;

    /* argument checking in case we were not called from ucol_swap() */
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<-1 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData;
    outBytes=(uint8_t *)outData;

    inHeader=(const UCATableHeader *)inData;
    outHeader=(UCATableHeader *)outData;

    /*
     * The collation binary must contain at least the UCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==42*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    uprv_memset(&header, 0, sizeof(header));
    if(length<0) {
        header.size=udata_readInt32(ds, inHeader->size);
    } else if((length<(42*4) || length<(header.size=udata_readInt32(ds, inHeader->size)))) {
        udata_printError(ds, "ucol_swap(formatVersion=3): too few bytes (%d after header) for collation data\n",
                         length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    header.magic=ds->readUInt32(inHeader->magic);
    if(!(
        header.magic==UCOL_HEADER_MAGIC &&
        inHeader->formatVersion[0]==3 /*&&
        inHeader->formatVersion[1]>=0*/
    )) {
        udata_printError(ds, "ucol_swap(formatVersion=3): magic 0x%08x or format version %02x.%02x is not a collation binary\n",
                         header.magic,
                         inHeader->formatVersion[0], inHeader->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    if(inHeader->isBigEndian!=ds->inIsBigEndian || inHeader->charSetFamily!=ds->inCharset) {
        udata_printError(ds, "ucol_swap(formatVersion=3): endianness %d or charset %d does not match the swapper\n",
                         inHeader->isBigEndian, inHeader->charSetFamily);
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        /* copy everything, takes care of data that needs no swapping */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, header.size);
        }

        /* swap the necessary pieces in the order of their occurrence in the data */

        /* read more of the UCATableHeader (the size field was read above) */
        header.options=                 ds->readUInt32(inHeader->options);
        header.UCAConsts=               ds->readUInt32(inHeader->UCAConsts);
        header.contractionUCACombos=    ds->readUInt32(inHeader->contractionUCACombos);
        header.mappingPosition=         ds->readUInt32(inHeader->mappingPosition);
        header.expansion=               ds->readUInt32(inHeader->expansion);
        header.contractionIndex=        ds->readUInt32(inHeader->contractionIndex);
        header.contractionCEs=          ds->readUInt32(inHeader->contractionCEs);
        header.contractionSize=         ds->readUInt32(inHeader->contractionSize);
        header.endExpansionCE=          ds->readUInt32(inHeader->endExpansionCE);
        header.expansionCESize=         ds->readUInt32(inHeader->expansionCESize);
        header.endExpansionCECount=     udata_readInt32(ds, inHeader->endExpansionCECount);
        header.contractionUCACombosSize=udata_readInt32(ds, inHeader->contractionUCACombosSize);
        header.scriptToLeadByte=        ds->readUInt32(inHeader->scriptToLeadByte);
        header.leadByteToScript=        ds->readUInt32(inHeader->leadByteToScript);
        
        /* swap the 32-bit integers in the header */
        ds->swapArray32(ds, inHeader, (int32_t)((const char *)&inHeader->jamoSpecial-(const char *)inHeader),
                           outHeader, pErrorCode);
        ds->swapArray32(ds, &(inHeader->scriptToLeadByte), sizeof(header.scriptToLeadByte) + sizeof(header.leadByteToScript),
                           &(outHeader->scriptToLeadByte), pErrorCode);
        /* set the output platform properties */
        outHeader->isBigEndian=ds->outIsBigEndian;
        outHeader->charSetFamily=ds->outCharset;

        /* swap the options */
        if(header.options!=0) {
            ds->swapArray32(ds, inBytes+header.options, header.expansion-header.options,
                               outBytes+header.options, pErrorCode);
        }

        /* swap the expansions */
        if(header.mappingPosition!=0 && header.expansion!=0) {
            if(header.contractionIndex!=0) {
                /* expansions bounded by contractions */
                count=header.contractionIndex-header.expansion;
            } else {
                /* no contractions: expansions bounded by the main trie */
                count=header.mappingPosition-header.expansion;
            }
            ds->swapArray32(ds, inBytes+header.expansion, (int32_t)count,
                               outBytes+header.expansion, pErrorCode);
        }

        /* swap the contractions */
        if(header.contractionSize!=0) {
            /* contractionIndex: UChar[] */
            ds->swapArray16(ds, inBytes+header.contractionIndex, header.contractionSize*2,
                               outBytes+header.contractionIndex, pErrorCode);

            /* contractionCEs: CEs[] */
            ds->swapArray32(ds, inBytes+header.contractionCEs, header.contractionSize*4,
                               outBytes+header.contractionCEs, pErrorCode);
        }

        /* swap the main trie */
        if(header.mappingPosition!=0) {
            count=header.endExpansionCE-header.mappingPosition;
            utrie_swap(ds, inBytes+header.mappingPosition, (int32_t)count,
                          outBytes+header.mappingPosition, pErrorCode);
        }

        /* swap the max expansion table */
        if(header.endExpansionCECount!=0) {
            ds->swapArray32(ds, inBytes+header.endExpansionCE, header.endExpansionCECount*4,
                               outBytes+header.endExpansionCE, pErrorCode);
        }

        /* expansionCESize, unsafeCP, contrEndCP: uint8_t[], no need to swap */

        /* swap UCA constants */
        if(header.UCAConsts!=0) {
            /*
             * if UCAConsts!=0 then contractionUCACombos because we are swapping
             * the UCA data file, and we know that the UCA contains contractions
             */
            ds->swapArray32(ds, inBytes+header.UCAConsts, header.contractionUCACombos-header.UCAConsts,
                               outBytes+header.UCAConsts, pErrorCode);
        }

        /* swap UCA contractions */
        if(header.contractionUCACombosSize!=0) {
            count=header.contractionUCACombosSize*inHeader->contractionUCACombosWidth*U_SIZEOF_UCHAR;
            ds->swapArray16(ds, inBytes+header.contractionUCACombos, (int32_t)count,
                               outBytes+header.contractionUCACombos, pErrorCode);
        }
        
        /* swap the script to lead bytes */
        if(header.scriptToLeadByte!=0) {
            int indexCount = ds->readUInt16(*((uint16_t*)(inBytes+header.scriptToLeadByte))); // each entry = 2 * uint16
            int dataCount = ds->readUInt16(*((uint16_t*)(inBytes+header.scriptToLeadByte + 2))); // each entry = uint16
            ds->swapArray16(ds, inBytes+header.scriptToLeadByte, 
                                4 + (4 * indexCount) + (2 * dataCount),
                                outBytes+header.scriptToLeadByte, pErrorCode);
        }
        
        /* swap the lead byte to scripts */
        if(header.leadByteToScript!=0) {
            int indexCount = ds->readUInt16(*((uint16_t*)(inBytes+header.leadByteToScript))); // each entry = uint16
            int dataCount = ds->readUInt16(*((uint16_t*)(inBytes+header.leadByteToScript + 2))); // each entry = uint16
            ds->swapArray16(ds, inBytes+header.leadByteToScript, 
                                4 + (2 * indexCount) + (2 * dataCount),
                                outBytes+header.leadByteToScript, pErrorCode);
        }
    }

    return header.size;
}